

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HinOut.cpp
# Opt level: O1

void __thiscall HinOut::HinOut(HinOut *this,string *filenameIn,string *filenameOut)

{
  ostream *poVar1;
  
  HPreData::HPreData(&this->super_HPreData);
  (this->fileIn)._M_dataplus._M_p = (pointer)&(this->fileIn).field_2;
  (this->fileIn)._M_string_length = 0;
  (this->fileIn).field_2._M_local_buf[0] = '\0';
  (this->fileOut)._M_dataplus._M_p = (pointer)&(this->fileOut).field_2;
  (this->fileOut)._M_string_length = 0;
  (this->fileOut).field_2._M_local_buf[0] = '\0';
  memset(&this->oAstart,0,0xc0);
  std::__cxx11::string::_M_assign((string *)&this->fileIn);
  std::__cxx11::string::_M_assign((string *)&this->fileOut);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"File in is ",0xb);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(filenameIn->_M_dataplus)._M_p,
                      filenameIn->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"File out is ",0xc);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(filenameOut->_M_dataplus)._M_p,
                      filenameOut->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  this->oAcountX = 0;
  this->AcountX = 0;
  return;
}

Assistant:

HinOut::HinOut(string filenameIn, string filenameOut) {
	fileIn = filenameIn;
	fileOut = filenameOut;

	cout<<"File in is "<<filenameIn << endl;
	cout<<"File out is "<<filenameOut<< endl;
	oAcountX = 0;
	AcountX = 0;
}